

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::BufferInUseRenderTimeCase::init
          (BufferInUseRenderTimeCase *this,EVP_PKEY_CTX *ctx)

{
  char *pcVar1;
  uint uVar2;
  int extraout_EAX;
  TestLog *log;
  MessageBuilder *pMVar3;
  int numBytes;
  int numBytes_00;
  char *local_2d8;
  char *local_2d0;
  char *local_2a8;
  char *local_278;
  char *local_230;
  string local_220;
  string local_200;
  int local_1dc;
  int local_1d8;
  int local_1d4;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0 [3];
  undefined1 local_1a8 [8];
  MessageBuilder message;
  char *pcStack_20;
  bool isReferenceCase;
  char *uploadFunctionName;
  char *targetFunctionName;
  BufferInUseRenderTimeCase *this_local;
  
  targetFunctionName = (char *)this;
  RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>::init
            (&this->
              super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
             ,ctx);
  pcVar1 = "Draw method: drawElements";
  if ((this->
      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
      ).m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) {
    pcVar1 = "Draw method: drawArrays";
  }
  uploadFunctionName = pcVar1 + 0xd;
  if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) {
    local_230 = "bufferData";
  }
  else {
    local_230 = "mapBufferRange";
    if (this->m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) {
      local_230 = "bufferSubData";
    }
  }
  pcStack_20 = local_230;
  message.m_str._375_1_ = this->m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER;
  log = tcu::TestContext::getLog
                  ((this->
                   super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                   ).super_RenderPerformanceTestBase.super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx);
  tcu::MessageBuilder::MessageBuilder((MessageBuilder *)local_1a8,log);
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1a8,(char (*) [28])"Measuring the time used in ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&uploadFunctionName);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [25])" call, a buffer upload, ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&uploadFunctionName);
  tcu::MessageBuilder::operator<<
            (pMVar3,(char (*) [82])
                    " call using the uploaded buffer and readPixels call with different upload sizes.\n"
            );
  if ((message.m_str._375_1_ & 1) == 0) {
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1a8,(char (*) [12])"Rendering:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [42])"    before test: create and use buffer B\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [39])"    first draw: render using buffer B\n");
    if (this->m_uploadRange == UPLOADRANGE_FULL) {
      local_2a8 = "    upload: respecify buffer B contents\n";
    }
    else {
      local_2a8 = (char *)0x0;
      if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
        local_2a8 = "    upload: modify buffer B contents\n";
      }
    }
    local_1c8 = local_2a8;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1c8);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [40])"    second draw: render using buffer B\n");
    tcu::MessageBuilder::operator<<(pMVar3,(char (*) [22])"    read: readPixels\n");
  }
  else {
    pMVar3 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_1a8,(char (*) [12])"Rendering:\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [49])"    before test: create and use buffers B and C\n");
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [39])"    first draw: render using buffer B\n");
    if (this->m_uploadRange == UPLOADRANGE_FULL) {
      local_278 = "    upload: respecify buffer C contents\n";
    }
    else {
      local_278 = (char *)0x0;
      if (this->m_uploadRange == UPLOADRANGE_PARTIAL) {
        local_278 = "    upload: modify buffer C contents\n";
      }
    }
    local_1c0[0] = local_278;
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c0);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (pMVar3,(char (*) [40])"    second draw: render using buffer C\n");
    tcu::MessageBuilder::operator<<(pMVar3,(char (*) [22])"    read: readPixels\n");
  }
  pMVar3 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_1a8,(char (*) [17])"Uploading using ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&stack0xffffffffffffffe0);
  if (this->m_mapFlags == MAPFLAG_INVALIDATE_RANGE) {
    local_2d0 = ", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT";
  }
  else {
    if (this->m_mapFlags == MAPFLAG_INVALIDATE_BUFFER) {
      local_2d8 = ", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT";
    }
    else {
      local_2d8 = (char *)0x0;
      if (this->m_mapFlags == MAPFLAG_NONE) {
        local_2d8 = "";
      }
    }
    local_2d0 = local_2d8;
  }
  local_1d0 = local_2d0;
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d0);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b9e07b);
  local_1d4 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
              ::getNumSamples(&this->
                               super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                             );
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d4);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [44])" test samples. Sample order is randomized.\n");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [87])0x2bdd6c9);
  pMVar3 = tcu::MessageBuilder::operator<<
                     (pMVar3,(char (*) [34])"Workload sizes are in the range [");
  local_1d8 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
              ::getMinWorkloadSize
                        (&this->
                          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        );
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1d8);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [4])",  ");
  local_1dc = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
              ::getMaxWorkloadSize
                        (&this->
                          super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                        );
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_1dc);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [12])"] vertices ");
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [3])0x2bdf031);
  uVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMinWorkloadDataSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)(ulong)uVar2,numBytes);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_200);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2c6b075);
  uVar2 = RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
          ::getMaxWorkloadDataSize
                    (&this->
                      super_RenderCase<deqp::gles3::Performance::(anonymous_namespace)::RenderUploadRenderReadDuration>
                    );
  Performance::(anonymous_namespace)::getHumanReadableByteSize_abi_cxx11_
            (&local_220,(_anonymous_namespace_ *)(ulong)uVar2,numBytes_00);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,&local_220);
  pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [21])"] to be processed).\n");
  tcu::MessageBuilder::operator<<
            (pMVar3,(char (*) [109])
                    "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n"
            );
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_200);
  if ((message.m_str._375_1_ & 1) == 0) {
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,
               (char (*) [155])
               "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n"
              );
  }
  else {
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,
               (char (*) [137])
               "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results."
              );
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_1a8);
  return extraout_EAX;
}

Assistant:

void BufferInUseRenderTimeCase::init (void)
{
	RenderCase<RenderUploadRenderReadDuration>::init();

	// log
	{
		const char* const	targetFunctionName		= (m_drawMethod == DRAWMETHOD_DRAW_ARRAYS) ? ("drawArrays") : ("drawElements");
		const char* const	uploadFunctionName		= (m_uploadMethod == UPLOADMETHOD_BUFFER_DATA) ? ("bufferData") : (m_uploadMethod == UPLOADMETHOD_BUFFER_SUB_DATA) ? ("bufferSubData") : ("mapBufferRange");
		const bool			isReferenceCase			= (m_uploadBufferTarget == UPLOADBUFFERTARGET_DIFFERENT_BUFFER);
		tcu::MessageBuilder	message					(&m_testCtx.getLog());

		message	<< "Measuring the time used in " << targetFunctionName << " call, a buffer upload, "
				<< targetFunctionName << " call using the uploaded buffer and readPixels call with different upload sizes.\n";

		if (isReferenceCase)
			message << "Rendering:\n"
					<< "    before test: create and use buffers B and C\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer C contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer C contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer C\n"
					<< "    read: readPixels\n";
		else
			message << "Rendering:\n"
					<< "    before test: create and use buffer B\n"
					<< "    first draw: render using buffer B\n"
					<< ((m_uploadRange == UPLOADRANGE_FULL)		? ("    upload: respecify buffer B contents\n")	:
						(m_uploadRange == UPLOADRANGE_PARTIAL)	? ("    upload: modify buffer B contents\n")	:
						((const char*)DE_NULL))
					<< "    second draw: render using buffer B\n"
					<< "    read: readPixels\n";

		message	<< "Uploading using " << uploadFunctionName
					<< ((m_mapFlags == MAPFLAG_INVALIDATE_RANGE)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_RANGE_BIT")	:
						(m_mapFlags == MAPFLAG_INVALIDATE_BUFFER)	? (", flags = MAP_WRITE_BIT | MAP_INVALIDATE_BUFFER_BIT")	:
						(m_mapFlags == MAPFLAG_NONE)				? ("")														:
						((const char*)DE_NULL))
					<< "\n"
				<< getNumSamples() << " test samples. Sample order is randomized.\n"
				<< "All samples at even positions (first = 0) are tested before samples at odd positions.\n"
				<< "Workload sizes are in the range ["
					<< getMinWorkloadSize() << ",  "
					<< getMaxWorkloadSize() << "] vertices "
					<< "(["
					<< getHumanReadableByteSize(getMinWorkloadDataSize()) << ","
					<< getHumanReadableByteSize(getMaxWorkloadDataSize()) << "] to be processed).\n"
				<< "Test result is the approximated processing rate in MiB / s of the second draw call and the readPixels call.\n";

		if (isReferenceCase)
			message	<< "Note! Test result should only be used as a baseline reference result for buffer.render_after_upload.draw_modify_draw test group results.";
		else
			message	<< "Note! Test result may not be useful as is but instead should be compared against the buffer.render_after_upload.reference.draw_upload_draw group results.\n";

		message << tcu::TestLog::EndMessage;
	}
}